

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * Bstrlib::operator+(CBString *__return_storage_ptr__,tagbstring *x,CBString *b)

{
  CBString local_38;
  CBString *local_20;
  CBString *b_local;
  tagbstring *x_local;
  
  local_20 = b;
  b_local = (CBString *)x;
  x_local = (tagbstring *)__return_storage_ptr__;
  CBString::CBString(&local_38,x);
  CBString::operator+(__return_storage_ptr__,&local_38,local_20);
  CBString::~CBString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const CBString operator + (const tagbstring& x, const CBString& b) {
	return CBString(x) + b;
}